

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

Matrix __thiscall maths::Matrix::createIdentity(Matrix *this,int size)

{
  int iVar1;
  uint uVar2;
  double *pdVar3;
  double **extraout_RDX;
  double **ppdVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  Matrix MVar8;
  
  Matrix(this,size,size);
  iVar1 = this->rows_;
  ppdVar4 = extraout_RDX;
  if (0 < (long)iVar1) {
    uVar2 = this->cols_;
    ppdVar4 = this->p;
    uVar5 = 0;
    do {
      if (0 < (int)uVar2) {
        pdVar3 = ppdVar4[uVar5];
        uVar6 = 0;
        do {
          uVar7 = 0x3ff00000;
          if (uVar5 != uVar6) {
            uVar7 = 0;
          }
          pdVar3[uVar6] = (double)((ulong)uVar7 << 0x20);
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (long)iVar1);
  }
  MVar8.p = ppdVar4;
  MVar8._0_8_ = this;
  return MVar8;
}

Assistant:

Matrix Matrix::createIdentity(int size)
{
    Matrix temp(size, size);
    for (int i = 0; i < temp.rows_; ++i) {
        for (int j = 0; j < temp.cols_; ++j) {
            if (i == j) {
                temp.p[i][j] = 1;
            } else {
                temp.p[i][j] = 0;
            }
        }
    }
    return temp;
}